

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O2

bool __thiscall chaiscript::parser::ChaiScript_Parser::Lambda(ChaiScript_Parser *this)

{
  pointer psVar1;
  pointer psVar2;
  bool bVar3;
  bool bVar4;
  eval_error *peVar5;
  size_t t_match_start;
  allocator local_81;
  File_Position local_80;
  string local_78;
  string local_58;
  string local_38;
  
  psVar1 = (this->m_match_stack).
           super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar2 = (this->m_match_stack).
           super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar3 = Keyword(this,"fun",false);
  if (bVar3) {
    t_match_start = (long)psVar1 - (long)psVar2 >> 4;
    bVar4 = Char(this,'[',false);
    if (bVar4) {
      Id_Arg_List(this);
      bVar4 = Char(this,']',false);
      if (!bVar4) {
        peVar5 = (eval_error *)__cxa_allocate_exception(0x90);
        std::__cxx11::string::string
                  ((string *)&local_78,"Incomplete anonymous function bind",&local_81);
        local_80.line = (this->m_position).line;
        local_80.column = (this->m_position).col;
        exception::eval_error::eval_error
                  (peVar5,&local_78,&local_80,
                   (this->m_filename).
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        __cxa_throw(peVar5,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
      }
    }
    else {
      std::__cxx11::string::string((string *)&local_38,"",(allocator *)&local_78);
      build_match<chaiscript::eval::Arg_List_AST_Node>(this,t_match_start,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
    bVar4 = Char(this,'(',false);
    if (!bVar4) {
      peVar5 = (eval_error *)__cxa_allocate_exception(0x90);
      std::__cxx11::string::string((string *)&local_78,"Incomplete anonymous function",&local_81);
      local_80.line = (this->m_position).line;
      local_80.column = (this->m_position).col;
      exception::eval_error::eval_error
                (peVar5,&local_78,&local_80,
                 (this->m_filename).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      __cxa_throw(peVar5,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    Decl_Arg_List(this);
    bVar4 = Char(this,')',false);
    if (!bVar4) {
      peVar5 = (eval_error *)__cxa_allocate_exception(0x90);
      std::__cxx11::string::string((string *)&local_78,"Incomplete anonymous function",&local_81);
      local_80.line = (this->m_position).line;
      local_80.column = (this->m_position).col;
      exception::eval_error::eval_error
                (peVar5,&local_78,&local_80,
                 (this->m_filename).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      __cxa_throw(peVar5,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    do {
      bVar4 = Eol(this);
    } while (bVar4);
    bVar4 = Block(this);
    if (!bVar4) {
      peVar5 = (eval_error *)__cxa_allocate_exception(0x90);
      std::__cxx11::string::string((string *)&local_78,"Incomplete anonymous function",&local_81);
      local_80.line = (this->m_position).line;
      local_80.column = (this->m_position).col;
      exception::eval_error::eval_error
                (peVar5,&local_78,&local_80,
                 (this->m_filename).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      __cxa_throw(peVar5,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    std::__cxx11::string::string((string *)&local_58,"",(allocator *)&local_78);
    build_match<chaiscript::eval::Lambda_AST_Node>(this,t_match_start,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return bVar3;
}

Assistant:

bool Lambda() {
        bool retval = false;

        const auto prev_stack_top = m_match_stack.size();

        if (Keyword("fun")) {
          retval = true;

          if (Char('[')) {
            Id_Arg_List();
            if (!Char(']')) {
              throw exception::eval_error("Incomplete anonymous function bind", File_Position(m_position.line, m_position.col), *m_filename);
            }
          } else {
            // make sure we always have the same number of nodes
            build_match<eval::Arg_List_AST_Node>(prev_stack_top);
          }

          if (Char('(')) {
            Decl_Arg_List();
            if (!Char(')')) {
              throw exception::eval_error("Incomplete anonymous function", File_Position(m_position.line, m_position.col), *m_filename);
            }
          } else {
            throw exception::eval_error("Incomplete anonymous function", File_Position(m_position.line, m_position.col), *m_filename);
          }


          while (Eol()) {}

          if (!Block()) {
            throw exception::eval_error("Incomplete anonymous function", File_Position(m_position.line, m_position.col), *m_filename);
          }

          build_match<eval::Lambda_AST_Node>(prev_stack_top);
        }

        return retval;
      }